

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

myarima_object
search_arima(double *x,int N,int d,int D,int p_max,int q_max,int P_max,int Q_max,int Order_max,
            int stationary,int s,char *ic,int approximation,double *xreg,int r,double offset,
            int allowdrift,int allowmean,int verbose,int method)

{
  sarimax_object psVar1;
  int iVar2;
  myarima_object pmVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  int iVar5;
  ulong uVar6;
  int constant;
  ulong uVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 uStack_e8;
  int bestseasonal [4];
  double local_c8;
  double local_b0;
  undefined8 local_98;
  int bestorder [3];
  double local_80;
  int local_68;
  undefined4 uStack_64;
  int iStack_60;
  int iStack_5c;
  undefined8 local_58;
  int order [3];
  
  register0x00000008 = CONCAT44(in_register_0000000c,D);
  order[0] = 0;
  local_58 = 0;
  bestorder[0] = 0;
  local_98 = 0;
  local_68 = 0;
  uStack_64 = 0;
  iStack_60 = 0;
  iStack_5c = 0;
  uStack_e8 = 0;
  bestseasonal[0] = 0;
  bestseasonal[1] = 0;
  bestorder[2] = (D + d == 0 && allowmean != 0 || D + d == 1 && allowdrift != 0) + 1;
  local_b0 = 1.79769313486232e+308;
  uVar6 = 0;
  while ((int)uVar6 <= p_max) {
    bestseasonal._8_8_ = uVar6;
    for (iVar8 = 0; iVar5 = (int)uVar6, iVar8 <= q_max; iVar8 = iVar8 + 1) {
      for (iVar4 = 0; iVar4 <= P_max; iVar4 = iVar4 + 1) {
        iVar2 = order[2];
        for (iVar9 = 0; iVar9 <= Q_max; iVar9 = iVar9 + 1) {
          if (iVar8 + iVar5 + iVar4 + iVar9 <= Order_max) {
            local_80 = 0.0;
            uVar7 = 0;
            while (constant = (int)uVar7, bestorder[2] != constant) {
              local_58 = CONCAT44(d,(int)uVar6);
              if ((iVar4 == 0 && iVar2 == 0) && iVar9 == 0 || s == 0) {
                iStack_5c = 0;
                uStack_64 = 0;
                iStack_60 = 0;
                local_68 = 0;
              }
              else {
                uStack_64 = (undefined4)stack0xffffffffffffffb8;
                iStack_5c = s;
                local_68 = iVar4;
                iStack_60 = iVar9;
              }
              order[0] = iVar8;
              pmVar3 = myarima(x,N,(int *)&local_58,&local_68,constant,ic,
                               (int)in_stack_fffffffffffffee8,approximation,offset,xreg,r,(int *)0x0
                              );
              if (verbose == 1) {
                psVar1 = pmVar3->sarimax;
                dVar10 = pmVar3->ic;
                printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",
                       (ulong)(uint)psVar1->p,(ulong)(uint)d,(ulong)(uint)psVar1->q,
                       (ulong)(uint)psVar1->P,stack0xffffffffffffffb8,(ulong)(uint)psVar1->Q,uVar7);
              }
              else {
                dVar10 = pmVar3->ic;
              }
              if (dVar10 < local_b0) {
                bestorder[0] = order[0];
                local_98 = local_58;
                uStack_e8 = CONCAT44(uStack_64,local_68);
                bestseasonal[1] = iStack_5c;
                bestseasonal[0] = iStack_60;
                local_c8 = local_80;
                local_b0 = dVar10;
              }
              myarima_free(pmVar3);
              local_80 = local_80 + 1.0;
              uVar6 = bestseasonal._8_8_;
              uVar7 = (ulong)(constant + 1);
            }
          }
        }
      }
    }
    uVar6 = (ulong)(iVar5 + 1);
  }
  pmVar3 = myarima(x,N,(int *)&local_98,(int *)&uStack_e8,(int)local_c8,ic,
                   (int)in_stack_fffffffffffffee8,approximation,offset,xreg,r,(int *)0x0);
  if (((approximation != 0) && (pmVar3->ic == 1.79769313486232e+308)) && (!NAN(pmVar3->ic))) {
    myarima_free(pmVar3);
    pmVar3 = search_arima(x,N,d,(int)stack0xffffffffffffffb8,p_max,q_max,P_max,Q_max,Order_max,
                          stationary,s,ic,0,xreg,r,offset,allowdrift,allowmean,verbose,method);
  }
  return pmVar3;
}

Assistant:

myarima_object search_arima(double *x, int N,int d, int D, int p_max, int q_max, int P_max, int Q_max, int Order_max, int stationary,int s, const char *ic,
	int approximation, double *xreg, int r, double offset,int allowdrift, int allowmean,int verbose, int method) {

	int idrift, imean, maxK, i, j, I, J,K;
	double best_ic,bestK,iapprox;
	myarima_object bestfit;
	myarima_object fit;
	int order[3] = {0,0,0};
	int seasonal[4] = {0,0,0,0};
	int bestorder[3] = {0,0,0};
	int bestseasonal[4] = {0,0,0,0};
	int trace = 0;

	
	idrift = allowdrift && (d + D == 1);

	imean = allowmean && (d + D == 0);

	maxK = (idrift || imean);

	//serial implementation

	//printf("d %d D %d p_max %d q_max %d P_max %d Q_max %d maxK %d \n",d,D,p_max,q_max,P_max,Q_max,maxK);

	best_ic = DBL_MAX;

	for(i = 0; i <= p_max; ++i) {
		for(j = 0;j <= q_max;++j) {
			for(I = 0; I <= P_max;++I) {
				for(J = 0; J <= Q_max; ++J) {
					if (i+j+I+J <= Order_max) {
						for(K = 0; K <= maxK; ++K) {
							order[0] = i;
							order[1] = d;
							order[2] = j;
							
							// bug fix: still need to set PDQ or else carries over
							// prior PDQ parameters in seasonal which may be non 0 but then attempt
							// to optimize model with > 0 PDQ which can throw seg faults
							// for example in emle.fcssx when mutating phi which assumes s is > 0 if P+Q is > 0
							if (
								s == 0 ||
								(I == 0 && J == 0 && D == 0)
							) {
								seasonal[0] = seasonal[1] = seasonal[2] = seasonal[3] = 0;
							} else {
								seasonal[0] = I;
								seasonal[1] = D;
								seasonal[2] = J;
								seasonal[3] = s;
							}

							fit = myarima(x,N,order,seasonal, K, ic, trace, approximation, offset,xreg, r, NULL);
							if (verbose == 1) {
								printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",fit->sarimax->p,d,fit->sarimax->q,fit->sarimax->P,D,fit->sarimax->Q,K,fit->ic);
							}
							
							//myarima_summary(fit);

							if (best_ic > fit->ic) {
								best_ic = fit->ic;
								memcpy(bestorder,order,sizeof(int)*3);
								memcpy(bestseasonal,seasonal,sizeof(int)*4);
								bestK = K;
							}

							myarima_free(fit);

						}
					}
				}
			}
		}
	}

	//printf("best_ic %g \n",best_ic);

	bestfit = myarima(x,N,bestorder,bestseasonal, bestK, ic, trace, approximation, offset,xreg, r, NULL);

	if (approximation) {
		if (bestfit->ic == DBL_MAX) {
			iapprox = 0;
			myarima_free(bestfit);

			bestfit = search_arima(x,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,iapprox,xreg,r,offset,allowdrift,allowmean,verbose,method);

		}
	}


	return bestfit;
}